

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::SSDPRequester::OnTick(SSDPRequester *this)

{
  OutputWorker *this_00;
  uint64_t uVar1;
  Result result;
  undefined1 local_1c0 [16];
  long local_1b0;
  undefined1 local_1a8 [24];
  anon_enum_32 local_190;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (this->NeedsInitialization == true) {
    this->NeedsInitialization = false;
    InitializeSockets((SSDPRequester *)local_1c0);
    if ((StateMachine *)local_1c0._0_8_ != (StateMachine *)0x0) {
      Result::ToJson_abi_cxx11_((string *)(local_1c0 + 8),(Result *)local_1c0);
      if (DAT_001b8e60 < 5) {
        local_1a8._16_8_ = ModuleLogger._M_head_impl;
        local_190 = 4;
        std::__cxx11::ostringstream::ostringstream(local_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,DAT_001b8e90,DAT_001b8e98);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,"Socket initialization failed: ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_188,(char *)local_1c0._8_8_,local_1b0);
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)(local_1a8 + 0x10));
        std::__cxx11::ostringstream::~ostringstream(local_188);
        std::ios_base::~ios_base(local_118);
      }
      if ((AsioHost *)local_1c0._8_8_ != (AsioHost *)local_1a8) {
        operator_delete((void *)local_1c0._8_8_);
      }
      Result::~Result((Result *)local_1c0);
      return;
    }
    Result::~Result((Result *)local_1c0);
  }
  uVar1 = siamese::GetTimeUsec();
  if (5000000 < uVar1 - this->LastLANInfoRequestUsec) {
    uVar1 = siamese::GetTimeUsec();
    this->LastLANInfoRequestUsec = uVar1;
    PollLANInfo(this);
  }
  if (0 < this->AttemptsRemaining) {
    this->AttemptsRemaining = this->AttemptsRemaining + -1;
    RequestSSDP(this);
  }
  return;
}

Assistant:

void SSDPRequester::OnTick()
{
    // If initialization is needed:
    if (NeedsInitialization)
    {
        NeedsInitialization = false;

        // Attempt to initialize sockets
        Result result = InitializeSockets();

        // If attempt failed:
        if (result.IsFail())
        {
            ModuleLogger.Error("Socket initialization failed: ", result.ToJson());
            return;
        }
    }

    // If poll timer has expired:
    const uint64_t nowUsec = siamese::GetTimeUsec();
    if (nowUsec - LastLANInfoRequestUsec > protocol::kLANInfoIntervalUsec)
    {
        LastLANInfoRequestUsec = siamese::GetTimeUsec();

        // Check if LAN info changed
        PollLANInfo();
    }

    // If there are no multicasts requested:
    if (AttemptsRemaining <= 0) {
        return;
    }

    AttemptsRemaining--;

    // Request SSDP from gateway
    RequestSSDP();
}